

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O2

int __thiscall gvr::Mesh::getUsedVertices(Mesh *this,vector<bool,_std::allocator<bool>_> *vused)

{
  int iVar1;
  int i;
  size_type sVar2;
  ulong uVar3;
  reference rVar4;
  
  std::vector<bool,_std::allocator<bool>_>::resize(vused,(long)(this->super_PointCloud).n,false);
  for (sVar2 = 0; (long)sVar2 < (long)(this->super_PointCloud).n; sVar2 = sVar2 + 1) {
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](vused,sVar2);
    *rVar4._M_p = *rVar4._M_p & ~rVar4._M_mask;
  }
  for (uVar3 = (ulong)(uint)(this->n * 3); 0 < (int)uVar3; uVar3 = uVar3 - 1) {
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (vused,(ulong)this->triangle[uVar3 - 1]);
    *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
  }
  iVar1 = 0;
  for (sVar2 = 0; (long)sVar2 < (long)(this->super_PointCloud).n; sVar2 = sVar2 + 1) {
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](vused,sVar2);
    iVar1 = (iVar1 + 1) - (uint)((rVar4._M_mask & *rVar4._M_p) == 0);
  }
  return iVar1;
}

Assistant:

int Mesh::getUsedVertices(std::vector<bool> &vused)
{
  vused.resize(getVertexCount());

  for (int i=0; i<getVertexCount(); i++)
  {
    vused[i]=false;
  }

  for (int i=3*getTriangleCount()-1; i>=0; i--)
  {
    vused[triangle[i]]=true;
  }

  int count=0;

  for (int i=0; i<getVertexCount(); i++)
    if (vused[i])
    {
      count++;
    }

  return count;
}